

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingFactored.cpp
# Opt level: O2

void __thiscall
ProblemFOBSFireFightingFactored::ProblemFOBSFireFightingFactored
          (ProblemFOBSFireFightingFactored *this,size_t nrAgents,size_t nrHouses,size_t nrFLs,
          double costOfMove,bool forcePositionRepres,bool initialize)

{
  undefined1 *this_00;
  size_t sVar1;
  pointer_____offset_0x160___ *this_01;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  undefined1 auVar2 [16];
  allocator<char> local_c9;
  undefined4 local_c8;
  undefined4 local_c4;
  size_t local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  size_t local_a8;
  size_t local_a0;
  double local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_c4 = CONCAT31(in_register_00000089,initialize);
  this_00 = &this->field_0x770;
  local_c8 = (undefined4)CONCAT71(in_register_00000081,forcePositionRepres);
  *(undefined ***)&this->field_0x770 = &PTR__POSGInterface_005f89e8;
  local_c0 = nrFLs;
  local_98 = costOfMove;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)this_00,&PTR_PTR_005f5a28);
  *(undefined8 *)&this->field_0x778 = 0x5f8bd0;
  *(undefined8 *)&this->field_0x770 = 0x5f8d80;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)this_00,&PTR_construction_vtable_232__005f5a00);
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface::
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface
            ((MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)&this->field_0x778,
             &PTR_construction_vtable_544__005f5a60);
  this_01 = &PTR_construction_vtable_352__005f59c8;
  FactoredDecPOMDPDiscreteInterface::FactoredDecPOMDPDiscreteInterface
            ((FactoredDecPOMDPDiscreteInterface *)this_00,&PTR_construction_vtable_352__005f59c8);
  sVar1 = local_c0;
  *(undefined8 *)
   &(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
    super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess = 0x5f4d28
  ;
  *(undefined8 *)&this->field_0x770 = 0x5f5320;
  local_b0 = 0x5f5320;
  *(undefined8 *)&this->field_0x778 = 0x5f5688;
  local_b8 = 0x5f4d28;
  *(undefined8 *)
   &(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
    super_MultiAgentDecisionProcessDiscreteFactoredStates.field_0x600 = 0x5f5120;
  SoftPrintBriefDescription_abi_cxx11_
            (&local_50,(ProblemFOBSFireFightingFactored *)this_01,nrAgents,nrHouses,local_c0);
  local_a8 = nrAgents;
  local_a0 = nrHouses;
  (**(code **)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x330))
            (&local_70,this,nrAgents,nrHouses,sVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"none",&local_c9);
  FactoredMMDPDiscrete::FactoredMMDPDiscrete
            (&this->super_FactoredMMDPDiscrete,&PTR_construction_vtable_112__005f58a8,&local_50,
             &local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined8 *)
   &(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
    super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess = local_b8
  ;
  *(undefined8 *)&this->field_0x770 = local_b0;
  *(undefined8 *)&this->field_0x778 = 0x5f5688;
  *(undefined8 *)
   &(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
    super_MultiAgentDecisionProcessDiscreteFactoredStates.field_0x600 = 0x5f5120;
  *(size_t *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.field_0x708 =
       local_a8;
  *(size_t *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.field_0x710 =
       local_a0;
  this->_m_nrFireLevels = local_c0;
  this->_m_costOfMove = local_98;
  auVar2 = ZEXT816(0) << 0x20;
  this->_m_forcePositionRepres = SUB41(local_c8,0);
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._0_8_;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)auVar2._8_8_;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar2._0_8_;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar2._8_8_;
  if ((char)local_c4 != '\0') {
    InitializePFFF(this);
  }
  return;
}

Assistant:

ProblemFOBSFireFightingFactored::ProblemFOBSFireFightingFactored(
    size_t nrAgents, size_t nrHouses, size_t nrFLs,
    double costOfMove, bool forcePositionRepres, bool initialize)
        :
        FactoredMMDPDiscrete(
            SoftPrintBriefDescription(nrAgents, nrHouses, nrFLs),
            SoftPrintDescription(nrAgents, nrHouses, nrFLs),
            "none"),
        _m_nrAgents(nrAgents),
        _m_nrHouses(nrHouses),
        _m_nrFireLevels(nrFLs),
        _m_costOfMove(costOfMove),
        _m_forcePositionRepres(forcePositionRepres)
{
    if(initialize)
        InitializePFFF();
}